

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_atomic_test.c
# Opt level: O1

char * test_scaling_equivalence(void)

{
  _Bool _Var1;
  int64_t iVar2;
  int64_t iVar3;
  char *pcVar4;
  double dVar5;
  double b;
  
  load_histograms();
  dVar5 = hdr_mean(cor_histogram);
  b = hdr_mean(scaled_cor_histogram);
  _Var1 = compare_double(dVar5 * 512.0,b,b * 1e-06);
  if (_Var1) {
    _Var1 = compare_int64(cor_histogram->total_count,scaled_cor_histogram->total_count);
    if (_Var1) {
      iVar2 = hdr_value_at_percentile(cor_histogram,99.0);
      iVar3 = hdr_value_at_percentile(scaled_cor_histogram,99.0);
      iVar2 = hdr_lowest_equivalent_value(cor_histogram,iVar2 << 9);
      iVar3 = hdr_lowest_equivalent_value(scaled_cor_histogram,iVar3);
      _Var1 = compare_int64(iVar2,iVar3);
      pcVar4 = (char *)0x0;
      if (!_Var1) {
        pcVar4 = "99%\'iles should be equivalent";
      }
    }
    else {
      pcVar4 = "Total count should be equivalent";
    }
  }
  else {
    pcVar4 = "Averages should be equivalent";
  }
  return pcVar4;
}

Assistant:

static char* test_scaling_equivalence(void)
{
    int64_t expected_99th, scaled_99th;
    load_histograms();

    mu_assert(
            "Averages should be equivalent",
            compare_values(
                    hdr_mean(cor_histogram) * 512,
                    hdr_mean(scaled_cor_histogram),
                    0.000001));

    mu_assert(
            "Total count should be equivalent",
            compare_int64(
                    cor_histogram->total_count,
                    scaled_cor_histogram->total_count));

    expected_99th = hdr_value_at_percentile(cor_histogram, 99.0) * 512;
    scaled_99th = hdr_value_at_percentile(scaled_cor_histogram, 99.0);
    mu_assert(
            "99%'iles should be equivalent",
            compare_int64(
                    hdr_lowest_equivalent_value(cor_histogram, expected_99th),
                    hdr_lowest_equivalent_value(scaled_cor_histogram, scaled_99th)));

    return 0;
}